

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edk2_vss2.cpp
# Opt level: O0

void __thiscall edk2_vss2_t::vss2_store_body_t::_read(vss2_store_body_t *this)

{
  uint8_t uVar1;
  vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>,_std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>_>_>
  *this_00;
  vss2_variable_t *this_01;
  pointer this_02;
  kstream *this_03;
  bool local_69;
  unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>
  local_40 [3];
  pointer local_28;
  vss2_variable_t *_;
  int i;
  vss2_store_body_t *local_10;
  vss2_store_body_t *this_local;
  
  local_10 = this;
  this_00 = (vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>,_std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>_>_>
             *)operator_new(0x18);
  memset(this_00,0,0x18);
  std::
  vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>,_std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>_>_>
  ::vector(this_00);
  std::
  unique_ptr<std::vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,std::default_delete<edk2_vss2_t::vss2_variable_t>>,std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,std::default_delete<edk2_vss2_t::vss2_variable_t>>>>,std::default_delete<std::vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,std::default_delete<edk2_vss2_t::vss2_variable_t>>,std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,std::default_delete<edk2_vss2_t::vss2_variable_t>>>>>>
  ::
  unique_ptr<std::default_delete<std::vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,std::default_delete<edk2_vss2_t::vss2_variable_t>>,std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,std::default_delete<edk2_vss2_t::vss2_variable_t>>>>>,void>
            ((unique_ptr<std::vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,std::default_delete<edk2_vss2_t::vss2_variable_t>>,std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,std::default_delete<edk2_vss2_t::vss2_variable_t>>>>,std::default_delete<std::vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,std::default_delete<edk2_vss2_t::vss2_variable_t>>,std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,std::default_delete<edk2_vss2_t::vss2_variable_t>>>>>>
              *)&stack0xffffffffffffffe8,this_00);
  std::
  unique_ptr<std::vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>,_std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>,_std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>_>_>_>_>
  ::operator=(&this->m_variables,
              (unique_ptr<std::vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>,_std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>,_std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>_>_>_>_>
               *)&stack0xffffffffffffffe8);
  std::
  unique_ptr<std::vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>,_std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>,_std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>,_std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>,_std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>_>_>_>_>
                 *)&stack0xffffffffffffffe8);
  _._4_4_ = 0;
  do {
    this_01 = (vss2_variable_t *)operator_new(0x240);
    vss2_variable_t::vss2_variable_t(this_01,(this->super_kstruct).m__io,this,this->m__root);
    local_28 = this_01;
    this_02 = std::
              unique_ptr<std::vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>,_std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>,_std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>_>_>_>_>
              ::operator->(&this->m_variables);
    std::unique_ptr<edk2_vss2_t::vss2_variable_t,std::default_delete<edk2_vss2_t::vss2_variable_t>>
    ::unique_ptr<std::default_delete<edk2_vss2_t::vss2_variable_t>,void>
              ((unique_ptr<edk2_vss2_t::vss2_variable_t,std::default_delete<edk2_vss2_t::vss2_variable_t>>
                *)local_40,local_28);
    std::
    vector<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>,_std::allocator<std::unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>_>_>
    ::push_back(this_02,(value_type *)local_40);
    std::
    unique_ptr<edk2_vss2_t::vss2_variable_t,_std::default_delete<edk2_vss2_t::vss2_variable_t>_>::
    ~unique_ptr(local_40);
    _._4_4_ = _._4_4_ + 1;
    uVar1 = vss2_variable_t::signature_first(local_28);
    local_69 = true;
    if (uVar1 == 0xaa) {
      this_03 = kaitai::kstruct::_io(&this->super_kstruct);
      local_69 = kaitai::kstream::is_eof(this_03);
    }
  } while (((local_69 ^ 0xffU) & 1) != 0);
  return;
}

Assistant:

void edk2_vss2_t::vss2_store_body_t::_read() {
    m_variables = std::unique_ptr<std::vector<std::unique_ptr<vss2_variable_t>>>(new std::vector<std::unique_ptr<vss2_variable_t>>());
    {
        int i = 0;
        vss2_variable_t* _;
        do {
            _ = new vss2_variable_t(m__io, this, m__root);
            m_variables->push_back(std::move(std::unique_ptr<vss2_variable_t>(_)));
            i++;
        } while (!( ((_->signature_first() != 170) || (_io()->is_eof())) ));
    }
}